

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O1

ISceneNode * __thiscall
irr::scene::CSceneManager::getSceneNodeFromType
          (CSceneManager *this,ESCENE_NODE_TYPE type,ISceneNode *start)

{
  int iVar1;
  ESCENE_NODE_TYPE EVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *plVar3;
  _List_node_base *p_Var4;
  
  if (start == (ISceneNode *)0x0) {
    iVar1 = (*(this->super_ISceneManager)._vptr_ISceneManager[9])(this);
    start = (ISceneNode *)CONCAT44(extraout_var,iVar1);
  }
  EVar2 = (*start->_vptr_ISceneNode[0x21])(start);
  if ((type != ESNT_ANY) && (EVar2 != type)) {
    plVar3 = &start->Children;
    p_Var4 = (_List_node_base *)plVar3;
    do {
      p_Var4 = (((_List_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *)
                &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var4 == (_List_node_base *)plVar3) {
        return (ISceneNode *)0x0;
      }
      iVar1 = (*(this->super_ISceneManager)._vptr_ISceneManager[0xc])(this,type,p_Var4[1]._M_next);
      start = (ISceneNode *)CONCAT44(extraout_var_00,iVar1);
    } while (start == (ISceneNode *)0x0);
  }
  return start;
}

Assistant:

ISceneNode *CSceneManager::getSceneNodeFromType(scene::ESCENE_NODE_TYPE type, ISceneNode *start)
{
	if (start == 0)
		start = getRootSceneNode();

	if (start->getType() == type || ESNT_ANY == type)
		return start;

	ISceneNode *node = 0;

	const ISceneNodeList &list = start->getChildren();
	ISceneNodeList::const_iterator it = list.begin();
	for (; it != list.end(); ++it) {
		node = getSceneNodeFromType(type, *it);
		if (node)
			return node;
	}

	return 0;
}